

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relation_statistics_helper.cpp
# Opt level: O2

RelationStats *
duckdb::RelationStatisticsHelper::ExtractDelimGetStats
          (RelationStats *__return_storage_ptr__,LogicalDelimGet *delim_get,ClientContext *context)

{
  int iVar1;
  undefined4 extraout_var;
  pointer pCVar2;
  _Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  RelationStats::RelationStats(__return_storage_ptr__);
  (*(delim_get->super_LogicalOperator)._vptr_LogicalOperator[3])(&local_70,delim_get);
  ::std::__cxx11::string::operator=
            ((string *)&__return_storage_ptr__->table_name,(string *)&local_70);
  ::std::__cxx11::string::~string((string *)&local_70);
  iVar1 = (*(delim_get->super_LogicalOperator)._vptr_LogicalOperator[7])(delim_get,context);
  __return_storage_ptr__->cardinality = CONCAT44(extraout_var,iVar1);
  __return_storage_ptr__->stats_initialized = true;
  (*(delim_get->super_LogicalOperator)._vptr_LogicalOperator[2])(&local_88,delim_get);
  for (pCVar2 = local_88._M_impl.super__Vector_impl_data._M_start;
      pCVar2 != local_88._M_impl.super__Vector_impl_data._M_finish; pCVar2 = pCVar2 + 1) {
    local_70._M_dataplus._M_p = (pointer)0x1;
    local_70._M_string_length._0_1_ = 0;
    ::std::vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>::
    emplace_back<duckdb::DistinctCount>
              ((vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_> *)
               __return_storage_ptr__,(DistinctCount *)&local_70);
    ::std::__cxx11::to_string(&local_50,pCVar2->column_index);
    ::std::operator+(&local_70,"column",&local_50);
    ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &__return_storage_ptr__->column_names,&local_70);
    ::std::__cxx11::string::~string((string *)&local_70);
    ::std::__cxx11::string::~string((string *)&local_50);
  }
  ::std::_Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>::~_Vector_base
            (&local_88);
  return __return_storage_ptr__;
}

Assistant:

RelationStats RelationStatisticsHelper::ExtractDelimGetStats(LogicalDelimGet &delim_get, ClientContext &context) {
	RelationStats stats;
	stats.table_name = delim_get.GetName();
	idx_t card = delim_get.EstimateCardinality(context);
	stats.cardinality = card;
	stats.stats_initialized = true;
	for (auto &binding : delim_get.GetColumnBindings()) {
		stats.column_distinct_count.push_back(DistinctCount({1, false}));
		stats.column_names.push_back("column" + to_string(binding.column_index));
	}
	return stats;
}